

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O0

storage_holder __thiscall
libtorrent::mmap_disk_io::new_torrent
          (mmap_disk_io *this,storage_params *params,shared_ptr<void> *owner)

{
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  undefined8 extraout_RDX;
  storage_holder sVar1;
  shared_ptr<libtorrent::aux::mmap_storage> local_58;
  storage_index_t local_48;
  storage_index_t idx;
  undefined1 local_38 [8];
  shared_ptr<libtorrent::aux::mmap_storage> storage;
  shared_ptr<void> *owner_local;
  storage_params *params_local;
  mmap_disk_io *this_local;
  
  storage.super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RCX;
  ::std::
  make_shared<libtorrent::aux::mmap_storage,libtorrent::storage_params_const&,libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>&>
            ((storage_params *)local_38,(file_pool_impl<libtorrent::aux::file_view_entry> *)owner);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
  libtorrent::aux::mmap_storage::set_owner
            (this_00,(shared_ptr<void> *)
                     storage.
                     super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  ::std::shared_ptr<libtorrent::aux::mmap_storage>::shared_ptr
            (&local_58,(shared_ptr<libtorrent::aux::mmap_storage> *)local_38);
  local_48 = libtorrent::aux::storage_array<libtorrent::aux::mmap_storage>::add
                       ((storage_array<libtorrent::aux::mmap_storage> *)&params[0xb].info_hash,
                        &local_58);
  ::std::shared_ptr<libtorrent::aux::mmap_storage>::~shared_ptr(&local_58);
  storage_holder::storage_holder((storage_holder *)this,local_48,(disk_interface *)params);
  ::std::shared_ptr<libtorrent::aux::mmap_storage>::~shared_ptr
            ((shared_ptr<libtorrent::aux::mmap_storage> *)local_38);
  sVar1._8_8_ = extraout_RDX;
  sVar1.m_disk_io = &this->super_disk_interface;
  return sVar1;
}

Assistant:

storage_holder mmap_disk_io::new_torrent(storage_params const& params
		, std::shared_ptr<void> const& owner)
	{
		TORRENT_ASSERT(params.files.is_valid());

		auto storage = std::make_shared<aux::mmap_storage>(params, m_file_pool);
		storage->set_owner(owner);
		storage_index_t const idx = m_torrents.add(std::move(storage));
		return storage_holder(idx, *this);
	}